

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O2

bool tchecker::is_initial(clockval_t *clockval)

{
  uint uVar1;
  rational<long> *prVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = 0;
  while (uVar3 = uVar1,
        uVar4 = (uint)(clockval->super_clock_value_array_t).super_clockval_base_t.
                      super_array_capacity_t<unsigned_short>._capacity, uVar3 < uVar4) {
    prVar2 = make_array_t<boost::rational<long>,_16UL,_tchecker::clockval_base_t>::operator[]
                       (&clockval->super_clock_value_array_t,(capacity_t_conflict)uVar3);
    if ((prVar2->den != 1) || (uVar1 = uVar3 + 1, prVar2->num != 0)) break;
  }
  return uVar4 <= uVar3;
}

Assistant:

bool is_initial(tchecker::clockval_t const & clockval)
{
  for (tchecker::clock_id_t id = 0; id < clockval.size(); ++id)
    if (clockval[id] != 0)
      return false;
  return true;
}